

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_resume_data.cpp
# Opt level: O1

entry * libtorrent::write_torrent_file
                  (entry *__return_storage_ptr__,add_torrent_params *atp,write_torrent_flags_t flags
                  )

{
  element_type *peVar1;
  size_type sVar2;
  pointer pcVar3;
  pointer pvVar4;
  pointer pbVar5;
  __uniq_ptr_data<unsigned_int,_std::default_delete<unsigned_int[]>,_true,_true> _Var6;
  digest32<256L> *pdVar7;
  pointer ppVar8;
  pointer pbVar9;
  void *pvVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  pointer pdVar12;
  pointer pdVar13;
  bool bVar14;
  int iVar15;
  int blocks_per_piece;
  entry *peVar16;
  vector<char,std::allocator<char>> *pvVar17;
  index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> iVar18;
  int64_t iVar19;
  char *pcVar20;
  pointer pvVar21;
  NodePtr commit_data;
  compact_rbtree_node<void_*> *pcVar22;
  string_type *psVar23;
  back_insert_iterator<std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>_> bVar24;
  vector<libtorrent::entry,std::allocator<libtorrent::entry>> *pvVar25;
  char cVar26;
  ulong uVar27;
  __uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_> *verified;
  file_index_t index;
  long lVar28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar29;
  pointer ppVar30;
  undefined8 uVar31;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *n;
  torrent_info *this;
  undefined8 uVar32;
  string_view key;
  string_view key_00;
  string_view key_01;
  string_view key_02;
  string_view key_03;
  span<const_libtorrent::digest32<256L>_> t_00;
  span<const_libtorrent::digest32<256L>_> t_01;
  string_view key_04;
  string_view key_05;
  string_view key_06;
  string_view key_07;
  string_view key_08;
  string_view key_09;
  string_view key_10;
  pair<boost::intrusive::compact_rbtree_node<void_*>_*,_bool> pVar33;
  vector<sha256_hash> piece_layer;
  bitfield empty_verified;
  insert_commit_data data;
  merkle_tree t;
  undefined1 local_1b8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  _Variadic_union<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>,_boost::container::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry,_libtorrent::aux::strview_less,_void,_void>,_std::vector<char,_std::allocator<char>_>,_libtorrent::entry_types::uninitialized_type>
  local_178;
  reference local_150;
  vector<sha256_hash> local_148;
  __uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_> local_130;
  undefined1 local_128 [16];
  node_ptr local_118;
  key_nodeptr_comp<boost::container::dtl::key_node_compare<libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_boost::move_detail::identity<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>_>_>
  local_110;
  bdecode_node local_108;
  torrent_info *local_c8;
  compact_rbtree_node<void_*> *local_c0;
  ulong local_b8;
  string_type local_b0;
  string_type local_90;
  string_type local_70;
  string_type local_50;
  
  entry::entry(__return_storage_ptr__);
  peVar1 = (atp->ti).super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  if (peVar1 == (element_type *)0x0) {
    local_108.m_tokens.
    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
    ._M_impl.super__Vector_impl_data._M_start._0_4_ = 4;
    aux::throw_ex<boost::system::system_error,libtorrent::errors::error_code_enum>
              ((error_code_enum *)&local_108);
  }
  pcVar20 = (peVar1->m_info_section).px;
  iVar15 = peVar1->m_info_section_size;
  key._M_str = "info";
  key._M_len = 4;
  peVar16 = entry::operator[](__return_storage_ptr__,key);
  pvVar17 = (vector<char,std::allocator<char>> *)entry::preformatted(peVar16);
  ::std::vector<char,std::allocator<char>>::_M_assign_aux<char_const*>
            (pvVar17,pcVar20,pcVar20 + iVar15);
  sVar2 = (atp->comment)._M_string_length;
  if (sVar2 != 0) {
    pcVar3 = (atp->comment)._M_dataplus._M_p;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    ::std::__cxx11::string::_M_construct<char*>((string *)&local_50,pcVar3,pcVar3 + sVar2);
    key_00._M_str = "comment";
    key_00._M_len = 7;
    peVar16 = entry::operator[](__return_storage_ptr__,key_00);
    entry::operator=(peVar16,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  lVar28 = atp->creation_date;
  if (lVar28 != 0) {
    key_01._M_str = "creation date";
    key_01._M_len = 0xd;
    peVar16 = entry::operator[](__return_storage_ptr__,key_01);
    entry::operator=(peVar16,lVar28);
  }
  sVar2 = (atp->created_by)._M_string_length;
  if (sVar2 != 0) {
    pcVar3 = (atp->created_by)._M_dataplus._M_p;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    ::std::__cxx11::string::_M_construct<char*>((string *)&local_70,pcVar3,pcVar3 + sVar2);
    key_02._M_str = "created by";
    key_02._M_len = 10;
    peVar16 = entry::operator[](__return_storage_ptr__,key_02);
    entry::operator=(peVar16,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  pvVar21 = (atp->merkle_trees).
            super_vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
            .
            super__Vector_base<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pvVar4 = (atp->merkle_trees).
           super_vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
           .
           super__Vector_base<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this = (atp->ti).super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (pvVar21 == pvVar4) {
    bVar14 = torrent_info::v2(this);
    if (bVar14 && (flags.m_val & 1) == 0) {
      local_108.m_tokens.
      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0xd6;
      aux::throw_ex<boost::system::system_error,libtorrent::errors::error_code_enum>
                ((error_code_enum *)&local_108);
    }
  }
  else {
    iVar15 = file_storage::num_files(&this->m_files);
    if (iVar15 != (int)((ulong)((long)pvVar4 - (long)pvVar21) >> 3) * -0x55555555) {
      local_108.m_tokens.
      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0xd6;
      aux::throw_ex<boost::system::system_error,libtorrent::errors::error_code_enum>
                ((error_code_enum *)&local_108);
    }
    key_03._M_str = "piece layers";
    key_03._M_len = 0xc;
    peVar16 = entry::operator[](__return_storage_ptr__,key_03);
    local_150 = (reference)entry::dict_abi_cxx11_(peVar16);
    local_130._M_t.super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
    super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl =
         (tuple<unsigned_int_*,_std::default_delete<unsigned_int[]>_>)
         (_Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>)0x0;
    iVar18 = file_storage::file_range(&this->m_files);
    local_b8 = (ulong)iVar18 >> 0x20;
    if (iVar18._begin.m_val.m_val != iVar18._end.m_val.m_val) {
      local_c0 = (compact_rbtree_node<void_*> *)
                 &(((tree<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_int,_libtorrent::aux::strview_less,_void,_void>
                     *)&local_150->super_type)->
                  super_node_alloc_holder<boost::container::new_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_>,_boost::intrusive::rbtree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_unsigned_long,_true,_void>_>
                  ).m_icont.
                  super_bstree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
                  .
                  super_bstbase<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                  .
                  super_bstbase_hack<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                  .
                  super_bstbase2<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_(boost::intrusive::algo_types)5,_void>
      ;
      lVar28 = (long)iVar18._begin.m_val.m_val;
      local_c8 = this;
      do {
        index.m_val = (int)lVar28;
        bVar14 = file_storage::pad_file_at(&this->m_files,index);
        if ((!bVar14) &&
           (iVar19 = file_storage::file_size(&this->m_files,index),
           (this->m_files).m_piece_length < iVar19)) {
          iVar15 = file_storage::file_num_blocks(&this->m_files,index);
          blocks_per_piece = file_storage::blocks_per_piece(&this->m_files);
          pcVar20 = file_storage::root_ptr(&this->m_files,index);
          aux::merkle_tree::merkle_tree((merkle_tree *)&local_108,iVar15,blocks_per_piece,pcVar20);
          pbVar5 = (atp->verified_leaf_hashes).
                   super_vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>.
                   super__Vector_base<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          verified = (__uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_> *)
                     (pbVar5 + lVar28);
          if ((int)((ulong)((long)(atp->verified_leaf_hashes).
                                  super_vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>
                                  .
                                  super__Vector_base<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar5) >> 3)
              <= lVar28) {
            verified = &local_130;
          }
          pvVar21 = (atp->merkle_trees).
                    super_vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
                    .
                    super__Vector_base<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar28;
          pbVar5 = (atp->merkle_tree_mask).
                   super_vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>.
                   super__Vector_base<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          if (((lVar28 < (int)((ulong)((long)(atp->merkle_tree_mask).
                                             super_vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>
                                             .
                                             super__Vector_base<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)pbVar5) >> 3)) &&
              (_Var6.super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
               super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl =
                    *(__uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_> *)
                     &pbVar5[lVar28].m_buf.
                      super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>,
              _Var6.super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
              super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
              super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl !=
              (tuple<unsigned_int_*,_std::default_delete<unsigned_int[]>_>)0x0)) &&
             (*(int *)_Var6.
                      super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t
                      .super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
                      super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl != 0)) {
            pdVar7 = *(digest32<256L> **)
                      &(pvVar21->
                       super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                       )._M_impl;
            t_00.m_len = (long)*(pointer *)
                                ((long)&(pvVar21->
                                        super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                                        )._M_impl + 8) - (long)pdVar7 >> 5;
            t_00.m_ptr = pdVar7;
            aux::merkle_tree::load_sparse_tree
                      ((merkle_tree *)&local_108,t_00,pbVar5 + lVar28,(bitfield *)verified);
          }
          else {
            pdVar7 = *(digest32<256L> **)
                      &(pvVar21->
                       super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                       )._M_impl;
            t_01.m_len = (long)*(pointer *)
                                ((long)&(pvVar21->
                                        super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                                        )._M_impl + 8) - (long)pdVar7 >> 5;
            t_01.m_ptr = pdVar7;
            aux::merkle_tree::load_tree((merkle_tree *)&local_108,t_01,(bitfield *)verified);
          }
          aux::merkle_tree::get_piece_layer(&local_148,(merkle_tree *)&local_108);
          pdVar13 = local_148.
                    super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                    .
                    super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          pdVar12 = local_148.
                    super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                    .
                    super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          iVar15 = file_storage::file_num_pieces(&this->m_files,index);
          if (iVar15 != (int)((ulong)((long)pdVar13 - (long)pdVar12) >> 5)) {
            local_1b8._0_4_ = 0xd7;
            aux::throw_ex<boost::system::system_error,libtorrent::errors::error_code_enum>
                      ((error_code_enum *)local_1b8);
          }
          aux::merkle_tree::root((merkle_tree *)&local_108);
          local_128._8_8_ = &DAT_00000020;
          local_1b8._0_8_ = &local_1a8;
          local_1b8._0_8_ =
               ::std::__cxx11::string::_M_create((ulong *)local_1b8,(ulong)(local_128 + 8));
          local_1a8._M_dataplus._M_p = (pointer)local_128._8_8_;
          (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8._0_8_)->
          field_2)._M_allocated_capacity = local_178._16_8_;
          *(undefined8 *)
           ((long)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_1b8._0_8_)->field_2 + 8) = local_178._24_8_;
          (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8._0_8_)->
          _M_dataplus)._M_p = (pointer)local_178._M_first._M_storage;
          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8._0_8_)->
          _M_string_length = local_178._8_8_;
          local_1b8._8_8_ = local_128._8_8_;
          *(undefined1 *)
           ((long)&(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_1b8._0_8_)->_M_dataplus)._M_p +
           (long)&((_Alloc_hider *)local_128._8_8_)->_M_p) = 0;
          local_128._8_8_ = local_128._8_8_ & 0xffffffffffffff00;
          local_118 = (node_ptr)0x0;
          local_128._0_8_ = local_c0;
          local_110.traits_ =
               (bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>
                *)local_c0;
          pVar33 = boost::intrusive::
                   bstree_algorithms<boost::intrusive::rbtree_node_traits<void*,true>>::
                   insert_unique_check<std::__cxx11::string,boost::intrusive::detail::key_nodeptr_comp<boost::container::dtl::key_node_compare<libtorrent::aux::strview_less,boost::container::dtl::select1st<std::__cxx11::string_const>>,boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<std::__cxx11::string_const,libtorrent::entry>,void*,(boost::container::tree_type_enum)0,true>,boost::intrusive::rbtree_node_traits<void*,true>,(boost::intrusive::link_mode_type)0,boost::intrusive::dft_tag,3u>,boost::move_detail::identity<boost::container::dtl::tree_node<std::pair<std::__cxx11::string_const,libtorrent::entry>,void*,(boost::container::tree_type_enum)0,true>>>>
                             ((const_node_ptr *)local_128,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_1b8,&local_110,(insert_commit_data *)(local_128 + 8),
                              (size_t *)0x0);
          pcVar22 = pVar33.first;
          if (((undefined1  [16])pVar33 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            commit_data = boost::container::dtl::
                          node_alloc_holder<boost::container::new_allocator<std::pair<std::__cxx11::string_const,libtorrent::entry>>,boost::intrusive::rbtree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<std::__cxx11::string_const,libtorrent::entry>,void*,(boost::container::tree_type_enum)0,true>,boost::intrusive::rbtree_node_traits<void*,true>,(boost::intrusive::link_mode_type)0,boost::intrusive::dft_tag,3u>,void,boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<std::__cxx11::string_const,libtorrent::entry>,void*,(boost::container::tree_type_enum)0,true>,boost::intrusive::tree_value_compare<std::pair<std::__cxx11::string_const,libtorrent::entry>*,libtorrent::aux::strview_less,boost::container::dtl::select1st<std::__cxx11::string_const>,bool,false>,bool>,unsigned_long,true,void>>
                          ::create_node<boost::container::try_emplace_t,std::__cxx11::string>
                                    ((node_alloc_holder<boost::container::new_allocator<std::pair<std::__cxx11::string_const,libtorrent::entry>>,boost::intrusive::rbtree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<std::__cxx11::string_const,libtorrent::entry>,void*,(boost::container::tree_type_enum)0,true>,boost::intrusive::rbtree_node_traits<void*,true>,(boost::intrusive::link_mode_type)0,boost::intrusive::dft_tag,3u>,void,boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<std::__cxx11::string_const,libtorrent::entry>,void*,(boost::container::tree_type_enum)0,true>,boost::intrusive::tree_value_compare<std::pair<std::__cxx11::string_const,libtorrent::entry>*,libtorrent::aux::strview_less,boost::container::dtl::select1st<std::__cxx11::string_const>,bool,false>,bool>,unsigned_long,true,void>>
                                      *)local_150,(try_emplace_t *)&local_110,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_1b8);
            boost::intrusive::
            bstree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
            ::insert_unique_commit
                      ((bstree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
                        *)local_128,local_150,(insert_commit_data *)commit_data);
            pcVar22 = (compact_rbtree_node<void_*> *)local_128._0_8_;
          }
          if (pcVar22 == (compact_rbtree_node<void_*> *)0x0) {
            __assert_fail("!!p","/usr/include/boost/intrusive/detail/hook_traits.hpp",0x3e,
                          "static pointer boost::intrusive::bhtraits_base<boost::container::dtl::tree_node<std::pair<const std::basic_string<char>, libtorrent::entry>, void *, boost::container::red_black_tree, true>, boost::intrusive::compact_rbtree_node<void *> *, boost::intrusive::dft_tag, 3>::to_value_ptr(const node_ptr &) [T = boost::container::dtl::tree_node<std::pair<const std::basic_string<char>, libtorrent::entry>, void *, boost::container::red_black_tree, true>, NodePtr = boost::intrusive::compact_rbtree_node<void *> *, Tag = boost::intrusive::dft_tag, Type = 3]"
                         );
          }
          psVar23 = entry::string_abi_cxx11_((entry *)&pcVar22[2].left_);
          pbVar29 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_148.
                    super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                    .
                    super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_148.
                    super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                    .
                    super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8._0_8_
              != &local_1a8) {
            operator_delete((void *)local_1b8._0_8_,(ulong)(local_1a8._M_dataplus._M_p + 1));
            pbVar29 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_148.
                      super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                      .
                      super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_148.
                      super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                      .
                      super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          }
          for (; pbVar29 != pbVar11; pbVar29 = pbVar29 + 1) {
            if (pbVar29 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
            {
              local_1b8._0_8_ = &local_1a8;
              ::std::__throw_logic_error("basic_string::_M_construct null not valid");
            }
            local_178._M_first._M_storage = (_Uninitialized<long,_true>)0x20;
            local_1b8._0_8_ = &local_1a8;
            local_1b8._0_8_ =
                 ::std::__cxx11::string::_M_create((ulong *)local_1b8,(ulong)&local_178);
            local_1a8._M_dataplus._M_p = (pointer)local_178._M_first._M_storage;
            pcVar3 = (pbVar29->_M_dataplus)._M_p;
            sVar2 = pbVar29->_M_string_length;
            uVar32 = *(undefined8 *)((long)&pbVar29->field_2 + 8);
            (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8._0_8_)
            ->field_2)._M_allocated_capacity = (pbVar29->field_2)._M_allocated_capacity;
            *(undefined8 *)
             ((long)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_1b8._0_8_)->field_2 + 8) = uVar32;
            (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8._0_8_)
            ->_M_dataplus)._M_p = pcVar3;
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8._0_8_)->
            _M_string_length = sVar2;
            local_1b8._8_8_ = local_178._M_first._M_storage;
            *(undefined1 *)
             ((long)&(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_1b8._0_8_)->_M_dataplus)._M_p + (long)local_178._M_first._M_storage) = 0
            ;
            ::std::__cxx11::string::_M_append((char *)psVar23,local_1b8._0_8_);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8._0_8_
                != &local_1a8) {
              operator_delete((void *)local_1b8._0_8_,(ulong)(local_1a8._M_dataplus._M_p + 1));
            }
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_148.
              super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
              .
              super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            operator_delete(local_148.
                            super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                            .
                            super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_148.
                                  super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                                  .
                                  super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_148.
                                  super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                                  .
                                  super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          this = local_c8;
          if (local_108.m_buffer != (char *)0x0) {
            operator_delete__(local_108.m_buffer);
          }
          local_108.m_buffer = (char *)0x0;
          if (local_108.m_tokens.
              super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
              ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
            operator_delete(local_108.m_tokens.
                            super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                            ._M_impl.super__Vector_impl_data._M_finish,
                            (long)local_108.m_root_tokens -
                            (long)local_108.m_tokens.
                                  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                  ._M_impl.super__Vector_impl_data._M_finish);
          }
        }
        lVar28 = lVar28 + 1;
      } while ((int)lVar28 != (int)local_b8);
    }
    if (local_130._M_t.super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
        super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl !=
        (_Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>)0x0) {
      operator_delete__((void *)local_130._M_t.
                                super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                                .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl);
    }
  }
  cVar26 = (char)((flags.m_val & 2) >> 1);
  if (cVar26 == '\0' &&
      (atp->url_seeds).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (atp->url_seeds).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    key_04._M_str = "url-list";
    key_04._M_len = 8;
    peVar16 = entry::operator[](__return_storage_ptr__,key_04);
    bVar24.container = entry::list(peVar16);
    ::std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::reserve
              (bVar24.container,
               (long)(atp->url_seeds).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(atp->url_seeds).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5);
    ::std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<std::__cxx11::string_const*,std::back_insert_iterator<std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>>>
              ((atp->url_seeds).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (atp->url_seeds).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,bVar24);
  }
  if (cVar26 == '\0' &&
      (atp->http_seeds).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (atp->http_seeds).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    key_05._M_str = "httpseeds";
    key_05._M_len = 9;
    peVar16 = entry::operator[](__return_storage_ptr__,key_05);
    bVar24.container = entry::list(peVar16);
    ::std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::reserve
              (bVar24.container,
               (long)(atp->http_seeds).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(atp->http_seeds).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5);
    ::std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<std::__cxx11::string_const*,std::back_insert_iterator<std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>>>
              ((atp->http_seeds).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (atp->http_seeds).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,bVar24);
  }
  if (((byte)((flags.m_val & 4) >> 2) &
      (atp->dht_nodes).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (atp->dht_nodes).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) == 1) {
    key_06._M_str = "nodes";
    key_06._M_len = 5;
    peVar16 = entry::operator[](__return_storage_ptr__,key_06);
    pvVar25 = (vector<libtorrent::entry,std::allocator<libtorrent::entry>> *)entry::list(peVar16);
    ::std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::reserve
              ((vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *)pvVar25,
               ((long)(atp->dht_nodes).
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(atp->dht_nodes).
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333);
    ppVar30 = (atp->dht_nodes).
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppVar8 = (atp->dht_nodes).
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (ppVar30 != ppVar8) {
      do {
        ::std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::vector
                  ((vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *)&local_108,2,
                   (allocator_type *)local_1b8);
        pcVar3 = (ppVar30->first)._M_dataplus._M_p;
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,pcVar3,pcVar3 + (ppVar30->first)._M_string_length);
        entry::operator=((entry *)CONCAT44(local_108.m_tokens.
                                           super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                           ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                           local_108.m_tokens.
                                           super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                           ._M_impl.super__Vector_impl_data._M_start._0_4_),
                         &local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        entry::operator=((entry *)(CONCAT44(local_108.m_tokens.
                                            super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                            ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                            local_108.m_tokens.
                                            super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                            ._M_impl.super__Vector_impl_data._M_start._0_4_) + 0x28)
                         ,(long)ppVar30->second);
        ::std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>::
        emplace_back<std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>>
                  (pvVar25,(vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *)
                           &local_108);
        ::std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::~vector
                  ((vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *)&local_108);
        ppVar30 = ppVar30 + 1;
      } while (ppVar30 != ppVar8);
    }
  }
  torrent_info::similar_torrents
            ((vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_> *)
             local_1b8,
             (atp->ti).super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  if (local_1b8._0_8_ == local_1b8._8_8_) {
    bVar14 = false;
  }
  else {
    torrent_info::info(&local_108,
                       (atp->ti).
                       super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,"similar");
    bVar14 = bdecode_node::operator_cast_to_bool(&local_108);
    bVar14 = !bVar14;
    pvVar10 = (void *)CONCAT44(local_108.m_tokens.
                               super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                               ._M_impl.super__Vector_impl_data._M_start._4_4_,
                               local_108.m_tokens.
                               super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                               ._M_impl.super__Vector_impl_data._M_start._0_4_);
    if (pvVar10 != (void *)0x0) {
      operator_delete(pvVar10,(long)local_108.m_tokens.
                                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)pvVar10);
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8._0_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete((void *)local_1b8._0_8_,(long)local_1a8._M_dataplus._M_p - local_1b8._0_8_);
  }
  if (bVar14) {
    key_07._M_str = "similar";
    key_07._M_len = 7;
    peVar16 = entry::operator[](__return_storage_ptr__,key_07);
    pvVar25 = (vector<libtorrent::entry,std::allocator<libtorrent::entry>> *)entry::list(peVar16);
    torrent_info::similar_torrents
              ((vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_> *)
               local_1b8,
               (atp->ti).super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
    ::std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::reserve
              ((vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *)pvVar25,
               ((long)(local_1b8._8_8_ - local_1b8._0_8_) >> 2) * -0x3333333333333333);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      operator_delete((void *)local_1b8._0_8_,(long)local_1a8._M_dataplus._M_p - local_1b8._0_8_);
    }
    torrent_info::similar_torrents
              ((vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_> *)
               &local_178._M_first,
               (atp->ti).super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
    uVar32 = local_178._8_8_;
    if (local_178._M_first._M_storage != (_Uninitialized<long,_true>)local_178._8_8_) {
      uVar31 = local_178._M_first._M_storage;
      do {
        local_1b8._0_8_ = &local_1a8;
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar31 ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          ::std::__throw_logic_error("basic_string::_M_construct null not valid");
        }
        local_148.
        super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
        super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x14;
        local_1b8._0_8_ = ::std::__cxx11::string::_M_create((ulong *)local_1b8,(ulong)&local_148);
        local_1a8._M_dataplus._M_p =
             (pointer)local_148.
                      super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                      .
                      super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        *(undefined4 *)
         &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8._0_8_)->
          field_2 = *(undefined4 *)(uVar31 + 0x10);
        sVar2 = *(size_type *)(uVar31 + 8);
        (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8._0_8_)->
        _M_dataplus)._M_p = *(pointer *)uVar31;
        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8._0_8_)->
        _M_string_length = sVar2;
        local_1b8._8_8_ =
             local_148.
             super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
             super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        *(undefined1 *)
         ((long)&(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_1b8._0_8_)->_M_dataplus)._M_p +
         (long)&((_Alloc_hider *)
                &(local_148.
                  super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                  .
                  super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->m_number)->_M_p) = 0;
        ::std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>::
        emplace_back<std::__cxx11::string>
                  (pvVar25,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1b8);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8._0_8_ !=
            &local_1a8) {
          operator_delete((void *)local_1b8._0_8_,(ulong)(local_1a8._M_dataplus._M_p + 1));
        }
        uVar31 = uVar31 + 0x14;
      } while (uVar31 != uVar32);
    }
    if (local_178._M_first._M_storage != 0) {
      operator_delete((void *)local_178._M_first._M_storage,local_178._16_8_ - local_178._0_8_);
    }
  }
  torrent_info::collections_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_178._M_first,
             (atp->ti).super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  if (local_178._M_first._M_storage == (_Uninitialized<long,_true>)local_178._8_8_) {
    bVar14 = false;
  }
  else {
    torrent_info::info((bdecode_node *)local_1b8,
                       (atp->ti).
                       super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,"collections");
    bVar14 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_1b8);
    bVar14 = !bVar14;
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      operator_delete((void *)local_1b8._0_8_,(long)local_1a8._M_dataplus._M_p - local_1b8._0_8_);
    }
  }
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_178._M_first);
  if (bVar14) {
    key_08._M_str = "collections";
    key_08._M_len = 0xb;
    peVar16 = entry::operator[](__return_storage_ptr__,key_08);
    pvVar25 = (vector<libtorrent::entry,std::allocator<libtorrent::entry>> *)entry::list(peVar16);
    torrent_info::collections_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_178._M_first,
               (atp->ti).super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
    ::std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::reserve
              ((vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *)pvVar25,
               (long)(local_178._8_8_ - local_178._0_8_) >> 5);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_178._M_first);
    torrent_info::collections_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_178._M_first,
               (atp->ti).super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
    for (uVar32 = local_178._M_first._M_storage; uVar32 != local_178._8_8_; uVar32 = uVar32 + 0x20)
    {
      ::std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>::
      emplace_back<std::__cxx11::string_const&>
                (pvVar25,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar32
                );
    }
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_178._M_first);
  }
  pbVar9 = (atp->trackers).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar27 = (long)(atp->trackers).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar9;
  if (uVar27 == 0x20) {
    pcVar3 = (pbVar9->_M_dataplus)._M_p;
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pcVar3,pcVar3 + pbVar9->_M_string_length);
    key_09._M_str = "announce";
    key_09._M_len = 8;
    peVar16 = entry::operator[](__return_storage_ptr__,key_09);
    entry::operator=(peVar16,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
  }
  else if (0x20 < uVar27) {
    anon_unknown_23::build_tracker_list
              ((entry *)&local_178._M_first,&atp->trackers,&atp->tracker_tiers);
    key_10._M_str = "announce-list";
    key_10._M_len = 0xd;
    peVar16 = entry::operator[](__return_storage_ptr__,key_10);
    entry::operator=(peVar16,(entry *)&local_178._M_first);
    entry::~entry((entry *)&local_178._M_first);
  }
  return __return_storage_ptr__;
}

Assistant:

entry write_torrent_file(add_torrent_params const& atp, write_torrent_flags_t const flags)
	{
		entry ret;
		if (!atp.ti)
			aux::throw_ex<system_error>(errors::torrent_missing_info);

		auto const info = atp.ti->info_section();
		ret["info"].preformatted().assign(info.data(), info.data() + info.size());

		if (!atp.comment.empty())
			ret["comment"] = atp.comment;
		if (atp.creation_date != 0)
			ret["creation date"] = atp.creation_date;
		if (!atp.created_by.empty())
			ret["created by"] = atp.created_by;

		if (!atp.merkle_trees.empty())
		{
			file_storage const& fs = atp.ti->files();
			auto& trees = atp.merkle_trees;
			if (int(trees.size()) != fs.num_files())
				aux::throw_ex<system_error>(errors::torrent_missing_piece_layer);

			auto& piece_layers = ret["piece layers"].dict();
			bitfield const empty_verified;
			for (file_index_t f : fs.file_range())
			{
				if (fs.pad_file_at(f) || fs.file_size(f) <= fs.piece_length())
					continue;

				aux::merkle_tree t(fs.file_num_blocks(f), fs.blocks_per_piece(), fs.root_ptr(f));

				bitfield const& verified = (f >= atp.verified_leaf_hashes.end_index())
					? empty_verified : atp.verified_leaf_hashes[f];

				auto const& tree = trees[f];
				if (f < atp.merkle_tree_mask.end_index() && !atp.merkle_tree_mask[f].empty())
				{
					t.load_sparse_tree(tree, atp.merkle_tree_mask[f], verified);
				}
				else
				{
					t.load_tree(tree, verified);
				}

				auto const piece_layer = t.get_piece_layer();
				if (int(piece_layer.size()) != fs.file_num_pieces(f))
					aux::throw_ex<system_error>(errors::torrent_invalid_piece_layer);

				auto& layer = piece_layers[t.root().to_string()].string();

				for (auto const& h : piece_layer)
					layer += h.to_string();
			}
		}
		else if (atp.ti->v2() && !(flags & write_flags::allow_missing_piece_layer))
		{
			// we must have piece layers for v2 torrents for them to be valid
			// .torrent files
			aux::throw_ex<system_error>(errors::torrent_missing_piece_layer);
		}

		// save web seeds
		if (!atp.url_seeds.empty() && !(flags & write_flags::no_http_seeds))
		{
			auto& url_list = ret["url-list"].list();
			url_list.reserve(atp.url_seeds.size());
			std::copy(atp.url_seeds.begin(), atp.url_seeds.end(), std::back_inserter(url_list));
		}

#if TORRENT_ABI_VERSION < 4
		if (!atp.http_seeds.empty() && !(flags & write_flags::no_http_seeds))
		{
			auto& httpseeds_list = ret["httpseeds"].list();
			httpseeds_list.reserve(atp.http_seeds.size());
			std::copy(atp.http_seeds.begin(), atp.http_seeds.end(), std::back_inserter(httpseeds_list));
		}
#endif

		// save DHT nodes
		if (!atp.dht_nodes.empty() && (flags & write_flags::include_dht_nodes))
		{
			auto& nodes = ret["nodes"].list();
			nodes.reserve(atp.dht_nodes.size());
			for (auto const& n : atp.dht_nodes)
			{
				entry::list_type node(2);
				node[0] = std::move(n.first);
				node[1] = n.second;
				nodes.emplace_back(std::move(node));
			}
		}

		if (!atp.ti->similar_torrents().empty() && !atp.ti->info("similar"))
		{
			auto& l = ret["similar"].list();
			l.reserve(atp.ti->similar_torrents().size());
			for (auto const& n : atp.ti->similar_torrents())
				l.emplace_back(n.to_string());
		}

		if (!atp.ti->collections().empty() && !atp.ti->info("collections"))
		{
			auto& l = ret["collections"].list();
			l.reserve(atp.ti->collections().size());
			for (auto const& n : atp.ti->collections())
				l.emplace_back(n);
		}

		// save trackers
		if (atp.trackers.size() == 1)
			ret["announce"] = atp.trackers.front();
		else if (atp.trackers.size() > 1)
			ret["announce-list"] = build_tracker_list(atp.trackers, atp.tracker_tiers);

		return ret;
	}